

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ncc_rule.cpp
# Opt level: O1

void line_ncc_rule(int n,double a,double b,double *x,double *w)

{
  size_t __n;
  bool bVar1;
  long lVar2;
  int iVar3;
  void *__s;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  
  uVar11 = (ulong)(uint)n;
  if (n == 1) {
    *x = (a + b) * 0.5;
  }
  else if (0 < n) {
    iVar3 = n + -1;
    dVar15 = (double)iVar3;
    uVar13 = 0;
    do {
      x[uVar13] = ((double)iVar3 * a + (double)(int)uVar13 * b) / dVar15;
      uVar13 = uVar13 + 1;
      iVar3 = iVar3 + -1;
    } while (uVar13 != uVar11);
  }
  uVar13 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar13 = (long)n * 8;
  }
  __s = operator_new__(uVar13);
  if (0 < n) {
    __n = uVar11 * 8;
    lVar2 = uVar11 * 8 + -0x10;
    lVar4 = (ulong)(n - 2) + 1;
    uVar13 = 0;
    do {
      memset(__s,0,__n);
      *(undefined8 *)((long)__s + uVar13 * 8) = 0x3ff0000000000000;
      if (n != 1) {
        uVar5 = 2;
        uVar7 = 1;
        sVar9 = __n;
        pdVar8 = x + -2;
        uVar12 = uVar7;
        do {
          do {
            *(double *)((long)__s + (sVar9 - 8)) =
                 (*(double *)((long)__s + (sVar9 - 0x10)) - *(double *)((long)__s + (sVar9 - 8))) /
                 (*(double *)((long)pdVar8 + sVar9) - *(double *)((long)x + (sVar9 - 8)));
            uVar7 = uVar7 + 1;
            sVar9 = sVar9 - 8;
          } while (uVar7 < uVar11);
          uVar5 = uVar5 + 1;
          uVar7 = uVar12 + 1;
          pdVar8 = pdVar8 + -1;
          sVar9 = __n;
          uVar12 = uVar7;
        } while (uVar5 != n + 1);
        if (n != 1) {
          uVar5 = 1;
          pdVar8 = x + (uVar11 - 2);
          uVar12 = uVar11;
          do {
            if (uVar5 < uVar11) {
              dVar15 = *(double *)((long)__s + uVar11 * 8 + -8);
              lVar10 = 0;
              do {
                dVar15 = *(double *)((long)__s + lVar10 * 8 + lVar2) - dVar15 * pdVar8[lVar10];
                *(double *)((long)__s + lVar10 * 8 + lVar2) = dVar15;
                lVar10 = lVar10 + -1;
              } while (1 - uVar12 != lVar10);
            }
            uVar5 = uVar5 + 1;
            uVar12 = (ulong)((int)uVar12 - 1);
            pdVar8 = pdVar8 + -1;
          } while (uVar5 != uVar11);
        }
      }
      dVar14 = *(double *)((long)__s + (long)n * 8 + -8) / (double)n;
      lVar10 = lVar4;
      dVar15 = dVar14;
      if (n != 1) {
        do {
          dVar15 = dVar15 * a + *(double *)((long)__s + lVar10 * 8 + -8) / (double)(int)lVar10;
          lVar6 = lVar10 + -1;
          bVar1 = 0 < lVar10;
          lVar10 = lVar6;
        } while (lVar6 != 0 && bVar1);
      }
      lVar10 = lVar4;
      if (n != 1) {
        do {
          dVar14 = dVar14 * b + *(double *)((long)__s + lVar10 * 8 + -8) / (double)(int)lVar10;
          lVar6 = lVar10 + -1;
          bVar1 = 0 < lVar10;
          lVar10 = lVar6;
        } while (lVar6 != 0 && bVar1);
      }
      w[uVar13] = dVar14 * b - dVar15 * a;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar11);
  }
  operator_delete__(__s);
  return;
}

Assistant:

void line_ncc_rule ( int n, double a, double b, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    LINE_NCC_RULE computes a Newton-Cotes Closed (NCC) quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      Integral ( A <= X <= B ) F(X) dx
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) ).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Input, double A, B, the endpoints of the interval.
//
//    Input, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *d;
  int i;
  int j;
  int k;
  double y_a;
  double y_b;
//
//  Define the points X.
//
  r8vec_linspace ( n, a, b, x );

  d = new double[n];

  for ( i = 0; i < n; i++ )
  {
//
//  Compute the Lagrange basis polynomial which is 1 at XTAB(I),
//  and zero at the other nodes.
//
    for ( j = 0; j < n; j++ )
    {
      d[j] = 0.0;
    }
    d[i] = 1.0;

    for ( j = 2; j <= n; j++ )
    {
      for ( k = j; k <= n; k++ )
      {
        d[n+j-k-1] = ( d[n+j-k-2] - d[n+j-k-1] ) / ( x[n-k] - x[n+j-k-1] );
      }
    }
    for ( j = 1; j <= n - 1; j++ )
    {
      for ( k = 1; k <= n - j; k++ )
      {
        d[n-k-1] = d[n-k-1] - x[n-k-j] * d[n-k];
      }
    }
//
//  Evaluate the antiderivative of the polynomial at the endpoints.
//
    y_a = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      y_a = y_a * a + d[j] / double( j + 1 );
    }
    y_a = y_a * a;

    y_b = d[n-1] / double( n );
    for ( j = n - 2; 0 <= j; j-- )
    {
      y_b = y_b * b + d[j] / double( j + 1 );
    }
    y_b = y_b * b;

    w[i] = y_b - y_a;
  }

  delete [] d;

  return;
}